

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

void __thiscall jrtplib::RTPSession::Destroy(RTPSession *this)

{
  RTPTransmitter *obj;
  RTCPCompoundPacket *obj_00;
  bool bVar1;
  RTPMemoryManager *pRVar2;
  reference ppRVar3;
  iterator local_38;
  _List_const_iterator<jrtplib::RTCPCompoundPacket_*> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTCPCompoundPacket_*> local_20;
  _List_const_iterator<jrtplib::RTCPCompoundPacket_*> local_18;
  const_iterator it;
  RTPSession *this_local;
  
  if ((this->created & 1U) != 0) {
    it._M_node = (_List_node_base *)this;
    if ((this->deletetransmitter & 1U) != 0) {
      obj = this->rtptrans;
      pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPTransmitter>(obj,pRVar2);
    }
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    RTCPScheduler::Reset(&this->rtcpsched);
    RTPCollisionList::Clear(&this->collisionlist);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::_List_const_iterator(&local_18);
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::begin
                   (&this->byepackets);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::_List_const_iterator
              (&local_20,&local_28);
    local_18._M_node = local_20._M_node;
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::end
                     (&this->byepackets);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::_List_const_iterator
                (&local_30,&local_38);
      bVar1 = std::operator!=(&local_18,&local_30);
      if (!bVar1) break;
      ppRVar3 = std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::operator*(&local_18);
      obj_00 = *ppRVar3;
      pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTCPCompoundPacket>(obj_00,pRVar2);
      std::_List_const_iterator<jrtplib::RTCPCompoundPacket_*>::operator++(&local_18,0);
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              (&this->byepackets);
    this->created = false;
  }
  return;
}

Assistant:

void RTPSession::Destroy()
{
	if (!created)
		return;

#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}